

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable.c
# Opt level: O0

CrispyValue ht_get(HashTable *ht,HTItemKey key)

{
  uint32_t uVar1;
  uint uVar2;
  CrispyValue *pCVar3;
  CrispyValue CVar4;
  CrispyValue *value;
  uint32_t index;
  HashTable *ht_local;
  HTItemKey key_local;
  CrispyValue v;
  
  uVar1 = hash(key,ht->key_type);
  uVar2 = uVar1 & ht->cap - 1;
  if ((ht->buckets[uVar2] == (HTItem *)0x0) ||
     (pCVar3 = find(ht->buckets[uVar2],key,ht->key_type), pCVar3 == (CrispyValue *)0x0)) {
    key_local.field_0.ident_length = 0;
    v.type = NIL;
    v._4_4_ = 0;
  }
  else {
    key_local.field_0.ident_length = *(undefined8 *)pCVar3;
    v._0_8_ = pCVar3->field_1;
  }
  CVar4._0_8_ = key_local.field_0.ident_length & 0xffffffff;
  CVar4.field_1 = (anon_union_8_3_4e733eb7_for_CrispyValue_1)v._0_8_;
  return CVar4;
}

Assistant:

CrispyValue ht_get(HashTable *ht, HTItemKey key) {
    uint32_t index = hash(key, ht->key_type) & (ht->cap - 1);

    if (ht->buckets[index] != NULL) {
        CrispyValue *value = find(ht->buckets[index], key, ht->key_type);
        if (value) {
            return *value;
        }
    }

    CrispyValue v;
    v.type = NIL;
    v.p_value = 0;
    return v;
}